

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_18f5b::AppImpl::immediatePanic(AppImpl *this)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<AppState> local_20;
  AppImpl *local_10;
  AppImpl *this_local;
  
  local_10 = this;
  puts("panic!");
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_preservedStateOnPanic);
  if (!bVar1) {
    peVar2 = std::__shared_ptr_access<AppState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AppState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_state);
    (*peVar2->_vptr_AppState[7])();
    std::shared_ptr<AppState>::operator=(&this->m_preservedStateOnPanic,&this->m_state);
    MakeState_Panic();
    std::shared_ptr<AppState>::operator=(&this->m_state,&local_20);
    std::shared_ptr<AppState>::~shared_ptr(&local_20);
    peVar2 = std::__shared_ptr_access<AppState,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AppState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_state);
    (*peVar2->_vptr_AppState[3])();
  }
  return;
}

Assistant:

void immediatePanic()
    {
        puts("panic!");
        if (m_preservedStateOnPanic)
        {
            // error: panicking while we are in panic?
            return;
        }
        m_state->deactivate();
        m_preservedStateOnPanic = m_state;
        m_state = MakeState_Panic();
        m_state->activate();
    }